

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# activity_tracking.hpp
# Opt level: O1

unique_ptr<so_5::disp::prio_one_thread::strictly_ordered::impl::actual_disp_iface_t,_std::default_delete<so_5::disp::prio_one_thread::strictly_ordered::impl::actual_disp_iface_t>_>
 __thiscall
so_5::stats::activity_tracking_stuff::
create_appropriate_disp<so_5::disp::prio_one_thread::strictly_ordered::impl::actual_disp_iface_t,so_5::disp::prio_one_thread::strictly_ordered::impl::dispatcher_template_t<so_5::disp::prio_one_thread::reuse::work_thread_template_t<so_5::disp::prio_one_thread::strictly_ordered::impl::demand_queue_t,so_5::disp::prio_one_thread::reuse::work_thread_details::no_activity_tracking_impl_t>>,so_5::disp::prio_one_thread::strictly_ordered::impl::dispatcher_template_t<so_5::disp::prio_one_thread::reuse::work_thread_template_t<so_5::disp::prio_one_thread::strictly_ordered::impl::demand_queue_t,so_5::disp::prio_one_thread::reuse::work_thread_details::with_activity_tracking_impl_t>>,so_5::environment_t,so_5::disp::prio_one_thread::strictly_ordered::disp_params_t,so_5::disp::prio_one_thread::strictly_ordered::disp_params_t&>
          (activity_tracking_stuff *this,environment_t *env,disp_params_t *disp_params,
          disp_params_t *args)

{
  queue_params_t *pqVar1;
  work_thread_activity_tracking_t wVar2;
  dispatcher_template_t<so_5::disp::prio_one_thread::reuse::work_thread_template_t<so_5::disp::prio_one_thread::strictly_ordered::impl::demand_queue_t,_so_5::disp::prio_one_thread::reuse::work_thread_details::with_activity_tracking_impl_t>_>
  *this_00;
  dispatcher_template_t<so_5::disp::prio_one_thread::reuse::work_thread_template_t<so_5::disp::prio_one_thread::strictly_ordered::impl::demand_queue_t,_so_5::disp::prio_one_thread::reuse::work_thread_details::no_activity_tracking_impl_t>_>
  *this_01;
  pointer *__ptr;
  disp_params_t local_70;
  disp_params_t local_48;
  
  *(undefined8 *)this = 0;
  wVar2 = (disp_params->
          super_work_thread_activity_tracking_flag_mixin_t<so_5::disp::prio_one_thread::strictly_ordered::disp_params_t>
          ).m_flag;
  if (wVar2 == unspecified) {
    wVar2 = environment_t::work_thread_activity_tracking(env);
  }
  if (wVar2 == on) {
    this_00 = (dispatcher_template_t<so_5::disp::prio_one_thread::reuse::work_thread_template_t<so_5::disp::prio_one_thread::strictly_ordered::impl::demand_queue_t,_so_5::disp::prio_one_thread::reuse::work_thread_details::with_activity_tracking_impl_t>_>
               *)operator_new(0x260);
    local_48.
    super_work_thread_activity_tracking_flag_mixin_t<so_5::disp::prio_one_thread::strictly_ordered::disp_params_t>
    .m_flag = (args->
              super_work_thread_activity_tracking_flag_mixin_t<so_5::disp::prio_one_thread::strictly_ordered::disp_params_t>
              ).m_flag;
    pqVar1 = &local_48.m_queue_params;
    std::
    function<std::unique_ptr<so_5::disp::mpsc_queue_traits::lock_t,_std::default_delete<so_5::disp::mpsc_queue_traits::lock_t>_>_()>
    ::function(&pqVar1->m_lock_factory,&(args->m_queue_params).m_lock_factory);
    so_5::disp::prio_one_thread::strictly_ordered::impl::
    dispatcher_template_t<so_5::disp::prio_one_thread::reuse::work_thread_template_t<so_5::disp::prio_one_thread::strictly_ordered::impl::demand_queue_t,_so_5::disp::prio_one_thread::reuse::work_thread_details::with_activity_tracking_impl_t>_>
    ::dispatcher_template_t(this_00,&local_48);
    *(dispatcher_template_t<so_5::disp::prio_one_thread::reuse::work_thread_template_t<so_5::disp::prio_one_thread::strictly_ordered::impl::demand_queue_t,_so_5::disp::prio_one_thread::reuse::work_thread_details::with_activity_tracking_impl_t>_>
      **)this = this_00;
    if (local_48.m_queue_params.m_lock_factory.super__Function_base._M_manager != (_Manager_type)0x0
       ) {
      (*local_48.m_queue_params.m_lock_factory.super__Function_base._M_manager)
                ((_Any_data *)pqVar1,(_Any_data *)pqVar1,__destroy_functor);
    }
  }
  else {
    this_01 = (dispatcher_template_t<so_5::disp::prio_one_thread::reuse::work_thread_template_t<so_5::disp::prio_one_thread::strictly_ordered::impl::demand_queue_t,_so_5::disp::prio_one_thread::reuse::work_thread_details::no_activity_tracking_impl_t>_>
               *)operator_new(0x210);
    local_70.
    super_work_thread_activity_tracking_flag_mixin_t<so_5::disp::prio_one_thread::strictly_ordered::disp_params_t>
    .m_flag = (args->
              super_work_thread_activity_tracking_flag_mixin_t<so_5::disp::prio_one_thread::strictly_ordered::disp_params_t>
              ).m_flag;
    pqVar1 = &local_70.m_queue_params;
    std::
    function<std::unique_ptr<so_5::disp::mpsc_queue_traits::lock_t,_std::default_delete<so_5::disp::mpsc_queue_traits::lock_t>_>_()>
    ::function(&pqVar1->m_lock_factory,&(args->m_queue_params).m_lock_factory);
    so_5::disp::prio_one_thread::strictly_ordered::impl::
    dispatcher_template_t<so_5::disp::prio_one_thread::reuse::work_thread_template_t<so_5::disp::prio_one_thread::strictly_ordered::impl::demand_queue_t,_so_5::disp::prio_one_thread::reuse::work_thread_details::no_activity_tracking_impl_t>_>
    ::dispatcher_template_t(this_01,&local_70);
    *(dispatcher_template_t<so_5::disp::prio_one_thread::reuse::work_thread_template_t<so_5::disp::prio_one_thread::strictly_ordered::impl::demand_queue_t,_so_5::disp::prio_one_thread::reuse::work_thread_details::no_activity_tracking_impl_t>_>
      **)this = this_01;
    if (local_70.m_queue_params.m_lock_factory.super__Function_base._M_manager != (_Manager_type)0x0
       ) {
      (*local_70.m_queue_params.m_lock_factory.super__Function_base._M_manager)
                ((_Any_data *)pqVar1,(_Any_data *)pqVar1,__destroy_functor);
    }
  }
  return (__uniq_ptr_data<so_5::disp::prio_one_thread::strictly_ordered::impl::actual_disp_iface_t,_std::default_delete<so_5::disp::prio_one_thread::strictly_ordered::impl::actual_disp_iface_t>,_true,_true>
          )(__uniq_ptr_data<so_5::disp::prio_one_thread::strictly_ordered::impl::actual_disp_iface_t,_std::default_delete<so_5::disp::prio_one_thread::strictly_ordered::impl::actual_disp_iface_t>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr< COMMON_DISP_IFACE_TYPE >
create_appropriate_disp(
	ENV & env,
	const DISP_PARAMS & disp_params,
	ARGS && ...args )
	{
		std::unique_ptr< COMMON_DISP_IFACE_TYPE > disp;

		auto tracking = disp_params.work_thread_activity_tracking();
		if( work_thread_activity_tracking_t::unspecified == tracking )
			tracking = env.work_thread_activity_tracking();

		if( work_thread_activity_tracking_t::on == tracking )
			disp.reset(
				new DISP_WITH_TRACKING{ std::forward<ARGS>(args)... } );
		else
			disp.reset(
				new DISP_NO_TRACKING{ std::forward<ARGS>(args)... } );

		return disp;
	}